

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadBone(OgreBinarySerializer *this,Skeleton *skeleton)

{
  ushort uVar1;
  uint16_t uVar2;
  Bone *this_00;
  size_type sVar3;
  DeadlyImportError *this_01;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *pbVar5;
  Logger *this_02;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  string local_210;
  undefined1 local_1e9;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_70;
  string local_50;
  Bone *local_20;
  Bone *bone;
  Skeleton *skeleton_local;
  OgreBinarySerializer *this_local;
  
  bone = (Bone *)skeleton;
  skeleton_local = (Skeleton *)this;
  this_00 = (Bone *)operator_new(0xf8);
  Bone::Bone(this_00);
  local_20 = this_00;
  ReadLine_abi_cxx11_(&local_50,this);
  std::__cxx11::string::operator=((string *)&local_20->name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  uVar2 = Read<unsigned_short>(this);
  local_20->id = uVar2;
  ReadVector(this,&local_20->position);
  ReadQuaternion(this,&local_20->rotation);
  if (0x24 < this->m_currentLen) {
    ReadVector(this,&local_20->scale);
  }
  uVar1 = local_20->id;
  sVar3 = std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::size
                    ((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *)bone);
  if (uVar1 != sVar3) {
    local_1e9 = 1;
    this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
              (&local_1e8);
    pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        &local_1e8,
                        (char (*) [64])
                        "Ogre Skeleton bone indexes not contiguous. Error at bone index ");
    pbVar5 = (basic_formatter *)
             Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
             operator<<(pbVar4,&local_20->id);
    Formatter::basic_formatter::operator_cast_to_string(&local_70,pbVar5);
    DeadlyImportError::DeadlyImportError(this_01,&local_70);
    local_1e9 = 0;
    __cxa_throw(this_01,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this_02 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[5]>(&local_388,(char (*) [5])"    ");
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_388,&local_20->id);
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar4,(char (*) [2])0xc0dfd7);
  pbVar5 = (basic_formatter *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                     (pbVar4,&local_20->name);
  Formatter::basic_formatter::operator_cast_to_string(&local_210,pbVar5);
  Logger::debug(this_02,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_formatter
            (&local_388);
  std::vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>::push_back
            ((vector<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_> *)bone,&local_20);
  return;
}

Assistant:

void OgreBinarySerializer::ReadBone(Skeleton *skeleton)
{
    Bone *bone = new Bone();
    bone->name = ReadLine();
    bone->id = Read<uint16_t>();

    // Pos and rot
    ReadVector(bone->position);
    ReadQuaternion(bone->rotation);

    // Scale (optional)
    if (m_currentLen > MSTREAM_BONE_SIZE_WITHOUT_SCALE)
        ReadVector(bone->scale);

    // Bone indexes need to start from 0 and be contiguous
    if (bone->id != skeleton->bones.size()) {
        throw DeadlyImportError(Formatter::format() << "Ogre Skeleton bone indexes not contiguous. Error at bone index " << bone->id);
    }

    ASSIMP_LOG_DEBUG_F( "    ", bone->id, " ", bone->name);

    skeleton->bones.push_back(bone);
}